

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

void __thiscall iqnet::ssl::exception::exception(exception *this,unsigned_long err)

{
  char *__s;
  allocator<char> local_19;
  unsigned_long local_18;
  unsigned_long err_local;
  exception *this_local;
  
  local_18 = err;
  err_local = (unsigned_long)this;
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__exception_00254698;
  this->ssl_err = local_18;
  __s = ERR_reason_error_string(this->ssl_err);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->msg,__s,&local_19);
  std::allocator<char>::~allocator(&local_19);
  std::__cxx11::string::insert((ulong)&this->msg,(char *)0x0);
  return;
}

Assistant:

exception::exception( unsigned long err ) throw():
  ssl_err(err),
  msg( ERR_reason_error_string(ssl_err) )
{
  msg.insert(0, "SSL: ");
}